

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O1

bool __thiscall
ON_Plane::CreateFromFrame(ON_Plane *this,ON_3dPoint *P,ON_3dVector *X,ON_3dVector *Y)

{
  ON_3dVector *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  ON_3dVector localX;
  ON_3dVector localY;
  ON_3dVector local_78;
  ON_3dVector local_60;
  ON_3dVector local_48;
  
  dVar1 = X->z;
  dVar2 = X->x;
  dVar3 = X->y;
  local_78.z = Y->z;
  local_78.x = Y->x;
  local_78.y = Y->y;
  dVar4 = P->x;
  dVar5 = P->y;
  (this->origin).z = P->z;
  (this->origin).x = dVar4;
  (this->origin).y = dVar5;
  this_00 = &this->xaxis;
  (this->xaxis).x = dVar2;
  (this->xaxis).y = dVar3;
  (this->xaxis).z = dVar1;
  ON_3dVector::Unitize(this_00);
  dVar1 = ON_DotProduct(&local_78,this_00);
  ::operator*(&local_48,dVar1,this_00);
  ON_3dVector::operator-(&local_60,&local_78,&local_48);
  (this->yaxis).z = local_60.z;
  (this->yaxis).x = local_60.x;
  (this->yaxis).y = local_60.y;
  ON_3dVector::Unitize(&this->yaxis);
  ON_CrossProduct(&local_60,this_00,&this->yaxis);
  (this->zaxis).z = local_60.z;
  (this->zaxis).x = local_60.x;
  (this->zaxis).y = local_60.y;
  bVar6 = ON_3dVector::Unitize(&this->zaxis);
  ON_PlaneEquation::Create(&this->plane_equation,this->origin,this->zaxis);
  if (bVar6) {
    bVar6 = IsValid(this);
    if (bVar6) {
      dVar1 = ON_3dVector::operator*(&local_78,&this->zaxis);
      dVar2 = ON_3dVector::Length(&local_78);
      if (dVar2 * 1.490116119385e-08 < ABS(dVar1)) {
        bVar6 = false;
      }
    }
  }
  return bVar6;
}

Assistant:

bool ON_Plane::CreateFromFrame(
    const ON_3dPoint&  P, // point on the plane
    const ON_3dVector& X, // non-zero vector in plane
    const ON_3dVector& Y  // another non-zero vector in the plane
    )
{
  const ON_3dPoint localP(P);
  const ON_3dVector localX(X);
  const ON_3dVector localY(Y);


  origin = localP;

  xaxis = localX;
  xaxis.Unitize();
  yaxis = localY - ON_DotProduct( localY, xaxis)*xaxis;
  yaxis.Unitize();
  zaxis = ON_CrossProduct( xaxis, yaxis );
  bool b = zaxis.Unitize();
  UpdateEquation();
  if ( b )
  {
    // 11 February 2004 Dale Lear
    //     Add more validation checks.
    b = IsValid();
    if ( b )
    {
      // make sure zaxis is perp to localY
      if ( fabs(localY*zaxis) > ON_SQRT_EPSILON*localY.Length() )
        b = false;
    }
  }
  return b;
}